

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nghttp2_frame_pack_settings(nghttp2_bufs *bufs,nghttp2_settings *frame)

{
  uint8_t **ppuVar1;
  nghttp2_buf_chain *pnVar2;
  int iVar3;
  size_t sVar4;
  uint8_t *buf;
  
  pnVar2 = bufs->head;
  if (pnVar2 == bufs->cur) {
    iVar3 = -0x20a;
    if ((frame->hd).length <= (ulong)((long)(pnVar2->buf).end - (long)(pnVar2->buf).last)) {
      buf = (pnVar2->buf).pos + -9;
      (pnVar2->buf).pos = buf;
      nghttp2_frame_pack_frame_hd(buf,&frame->hd);
      sVar4 = nghttp2_frame_pack_settings_payload((pnVar2->buf).last,frame->iv,frame->niv);
      ppuVar1 = &(pnVar2->buf).last;
      *ppuVar1 = *ppuVar1 + sVar4;
      iVar3 = 0;
    }
    return iVar3;
  }
  __assert_fail("bufs->head == bufs->cur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x1e8,"int nghttp2_frame_pack_settings(nghttp2_bufs *, nghttp2_settings *)");
}

Assistant:

int nghttp2_frame_pack_settings(nghttp2_bufs *bufs, nghttp2_settings *frame) {
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->head->buf;

  if (nghttp2_buf_avail(buf) < frame->hd.length) {
    return NGHTTP2_ERR_FRAME_SIZE_ERROR;
  }

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  buf->last +=
      nghttp2_frame_pack_settings_payload(buf->last, frame->iv, frame->niv);

  return 0;
}